

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O0

void read_archive(bsdtar *bsdtar,char mode,archive *writer)

{
  FILE *pFVar1;
  wchar_t wVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  int *piVar7;
  FILE *local_88;
  char *p_1;
  char *p;
  size_t opt_len;
  size_t module_len;
  int r;
  char *reader_options;
  archive_entry *entry;
  archive *a;
  FILE *out;
  progress_data progress_data;
  archive *writer_local;
  char mode_local;
  bsdtar *bsdtar_local;
  
  progress_data.entry = (archive_entry *)writer;
  while (*bsdtar->argv != (char *)0x0) {
    wVar2 = archive_match_include_pattern(bsdtar->matching,*bsdtar->argv);
    if (wVar2 != L'\0') {
      pcVar4 = archive_error_string(bsdtar->matching);
      lafe_errc(1,0,"Error inclusion pattern: %s",pcVar4);
    }
    bsdtar->argv = bsdtar->argv + 1;
  }
  if ((bsdtar->names_from_file != (char *)0x0) &&
     (wVar2 = archive_match_include_pattern_from_file
                        (bsdtar->matching,bsdtar->names_from_file,bsdtar->flags & 0x100),
     wVar2 != L'\0')) {
    pcVar4 = archive_error_string(bsdtar->matching);
    lafe_errc(1,0,"Error inclusion pattern: %s",pcVar4);
  }
  entry = (archive_entry *)archive_read_new();
  iVar3 = cset_read_support_filter_program(bsdtar->cset,(archive *)entry);
  if (iVar3 == 0) {
    archive_read_support_filter_all((archive *)entry);
  }
  archive_read_support_format_all((archive *)entry);
  pcVar4 = getenv("TAR_READER_OPTIONS");
  if (pcVar4 != (char *)0x0) {
    sVar5 = strlen(pcVar4);
    pcVar6 = (char *)malloc(sVar5 + 0x1e);
    if (pcVar6 == (char *)0x0) {
      piVar7 = __errno_location();
      lafe_errc(1,*piVar7,"Out of memory");
    }
    memcpy(pcVar6,"__ignore_wrong_module_name__,",0x1d);
    memcpy(pcVar6 + 0x1d,pcVar4,sVar5 + 1);
    wVar2 = archive_read_set_options((archive *)entry,pcVar6);
    free(pcVar6);
    if (wVar2 == L'\xffffffe2') {
      pcVar4 = archive_error_string((archive *)entry);
      lafe_errc(1,0,"%s",pcVar4);
    }
    archive_clear_error((archive *)entry);
  }
  wVar2 = archive_read_set_options((archive *)entry,bsdtar->option_options);
  if (wVar2 != L'\0') {
    pcVar4 = archive_error_string((archive *)entry);
    lafe_errc(1,0,"%s",pcVar4);
  }
  if (((bsdtar->flags & 0x10) != 0) &&
     (wVar2 = archive_read_set_options((archive *)entry,"read_concatenated_archives"),
     wVar2 != L'\0')) {
    pcVar4 = archive_error_string((archive *)entry);
    lafe_errc(1,0,"%s",pcVar4);
  }
  if (bsdtar->passphrase == (char *)0x0) {
    module_len._4_4_ =
         archive_read_set_passphrase_callback((archive *)entry,bsdtar,passphrase_callback);
  }
  else {
    module_len._4_4_ = archive_read_add_passphrase((archive *)entry,bsdtar->passphrase);
  }
  if (module_len._4_4_ != 0) {
    pcVar4 = archive_error_string((archive *)entry);
    lafe_errc(1,0,"%s",pcVar4);
  }
  wVar2 = archive_read_open_filename
                    ((archive *)entry,bsdtar->filename,(long)bsdtar->bytes_per_block);
  if (wVar2 != L'\0') {
    pcVar4 = archive_error_string((archive *)entry);
    lafe_errc(1,0,"Error opening archive: %s",pcVar4);
  }
  do_chdir(bsdtar);
  if (mode == 'x') {
    progress_data.bsdtar = (bsdtar *)entry;
    out = (FILE *)bsdtar;
    archive_read_extract_set_progress_callback((archive *)entry,progress_func,&out);
    if (((bsdtar->flags & 4) != 0) && (iVar3 = chroot("."), iVar3 != 0)) {
      piVar7 = __errno_location();
      lafe_errc(1,*piVar7,"Can\'t chroot to \".\"");
    }
  }
LAB_0010e451:
  do {
    do {
      while( true ) {
        do {
          while( true ) {
            while( true ) {
              if (((bsdtar->flags & 8) != 0) &&
                 (wVar2 = archive_match_path_unmatched_inclusions(bsdtar->matching), wVar2 == L'\0')
                 ) goto LAB_0010e95a;
              iVar3 = archive_read_next_header((archive *)entry,(archive_entry **)&reader_options);
              progress_data.archive = (archive *)reader_options;
              if (iVar3 == 1) goto LAB_0010e95a;
              if (iVar3 < 0) {
                pcVar4 = archive_error_string((archive *)entry);
                lafe_warnc(0,"%s",pcVar4);
              }
              if (iVar3 < -0x13) {
                bsdtar->return_value = 1;
              }
              if (iVar3 != -10) break;
              lafe_warnc(0,"Retrying...");
            }
            if (iVar3 == -0x1e) goto LAB_0010e95a;
            pcVar4 = archive_entry_pathname((archive_entry *)reader_options);
            if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) break;
            lafe_warnc(0,"Archive entry has empty or unreadable filename ... skipping.");
            bsdtar->return_value = 1;
          }
          if (-1 < bsdtar->uid) {
            archive_entry_set_uid((archive_entry *)reader_options,(long)bsdtar->uid);
            archive_entry_set_uname((archive_entry *)reader_options,(char *)0x0);
          }
          if (-1 < bsdtar->gid) {
            archive_entry_set_gid((archive_entry *)reader_options,(long)bsdtar->gid);
            archive_entry_set_gname((archive_entry *)reader_options,(char *)0x0);
          }
          if (bsdtar->uname != (char *)0x0) {
            archive_entry_set_uname((archive_entry *)reader_options,bsdtar->uname);
          }
          if (bsdtar->gname != (char *)0x0) {
            archive_entry_set_gname((archive_entry *)reader_options,bsdtar->gname);
          }
          wVar2 = archive_match_excluded(bsdtar->matching,(archive_entry *)reader_options);
        } while (wVar2 != L'\0');
        if (mode != 't') break;
        if ((bsdtar->flags & 0x800) == 0) {
          local_88 = _stdout;
        }
        else {
          local_88 = _stderr;
        }
        a = (archive *)local_88;
        if (bsdtar->verbose < 2) {
          pcVar4 = archive_entry_pathname((archive_entry *)reader_options);
          safe_fprintf((FILE *)local_88,"%s",pcVar4);
        }
        else {
          list_item_verbose(bsdtar,(FILE *)local_88,(archive_entry *)reader_options);
        }
        fflush((FILE *)a);
        iVar3 = archive_read_data_skip((archive *)entry);
        if (iVar3 == -0x14) {
          fprintf((FILE *)a,"\n");
          pcVar4 = archive_error_string((archive *)entry);
          lafe_warnc(0,"%s",pcVar4);
        }
        if (iVar3 == -10) {
          fprintf((FILE *)a,"\n");
          pcVar4 = archive_error_string((archive *)entry);
          lafe_warnc(0,"%s",pcVar4);
        }
        if (iVar3 == -0x1e) {
          fprintf((FILE *)a,"\n");
          pcVar4 = archive_error_string((archive *)entry);
          lafe_warnc(0,"%s",pcVar4);
          bsdtar->return_value = 1;
          goto LAB_0010e95a;
        }
        fprintf((FILE *)a,"\n");
      }
      wVar2 = edit_pathname(bsdtar,(archive_entry *)reader_options);
    } while (wVar2 != L'\0');
    if ((bsdtar->flags & 0x20) != 0) {
      archive_entry_pathname((archive_entry *)reader_options);
      wVar2 = yes("extract \'%s\'");
      if (wVar2 == L'\0') goto LAB_0010e451;
    }
    pFVar1 = _stderr;
    if (bsdtar->verbose < 2) {
      if (0 < bsdtar->verbose) {
        pcVar4 = archive_entry_pathname((archive_entry *)reader_options);
        safe_fprintf((FILE *)pFVar1,"x %s",pcVar4);
        fflush(_stderr);
      }
    }
    else {
      safe_fprintf((FILE *)_stderr,"x ");
      list_item_verbose(bsdtar,(FILE *)_stderr,(archive_entry *)reader_options);
      fflush(_stderr);
    }
    if ((bsdtar->flags & 0x800) == 0) {
      module_len._4_4_ =
           archive_read_extract2
                     ((archive *)entry,(archive_entry *)reader_options,
                      (archive *)progress_data.entry);
    }
    else {
      module_len._4_4_ = archive_read_data_into_fd((archive *)entry,1);
    }
    pFVar1 = _stderr;
    if (module_len._4_4_ != 0) {
      if (bsdtar->verbose == 0) {
        pcVar4 = archive_entry_pathname((archive_entry *)reader_options);
        safe_fprintf((FILE *)pFVar1,"%s",pcVar4);
      }
      pFVar1 = _stderr;
      pcVar4 = archive_error_string((archive *)entry);
      iVar3 = archive_errno((archive *)entry);
      pcVar6 = strerror(iVar3);
      safe_fprintf((FILE *)pFVar1,": %s: %s",pcVar4,pcVar6);
      if (bsdtar->verbose == 0) {
        fprintf(_stderr,"\n");
      }
      bsdtar->return_value = 1;
    }
    if (bsdtar->verbose != 0) {
      fprintf(_stderr,"\n");
    }
    if (module_len._4_4_ == -0x1e) {
LAB_0010e95a:
      iVar3 = archive_read_close((archive *)entry);
      if (iVar3 != 0) {
        pcVar4 = archive_error_string((archive *)entry);
        lafe_warnc(0,"%s",pcVar4);
      }
      if (iVar3 < -0x13) {
        bsdtar->return_value = 1;
      }
      pFVar1 = _stdout;
      if (2 < bsdtar->verbose) {
        pcVar4 = archive_format_name((archive *)entry);
        pcVar6 = archive_filter_name((archive *)entry,0);
        fprintf(pFVar1,"Archive Format: %s,  Compression: %s\n",pcVar4,pcVar6);
      }
      archive_read_free((archive *)entry);
      return;
    }
  } while( true );
}

Assistant:

static void
read_archive(struct bsdtar *bsdtar, char mode, struct archive *writer)
{
	struct progress_data	progress_data;
	FILE			 *out;
	struct archive		 *a;
	struct archive_entry	 *entry;
	const char		 *reader_options;
	int			  r;

	while (*bsdtar->argv) {
		if (archive_match_include_pattern(bsdtar->matching,
		    *bsdtar->argv) != ARCHIVE_OK)
			lafe_errc(1, 0, "Error inclusion pattern: %s",
			    archive_error_string(bsdtar->matching));
		bsdtar->argv++;
	}

	if (bsdtar->names_from_file != NULL)
		if (archive_match_include_pattern_from_file(
		    bsdtar->matching, bsdtar->names_from_file,
		    (bsdtar->flags & OPTFLAG_NULL)) != ARCHIVE_OK)
			lafe_errc(1, 0, "Error inclusion pattern: %s",
			    archive_error_string(bsdtar->matching));

	a = archive_read_new();
	if (cset_read_support_filter_program(bsdtar->cset, a) == 0)
		archive_read_support_filter_all(a);
	archive_read_support_format_all(a);

	reader_options = getenv(ENV_READER_OPTIONS);
	if (reader_options != NULL) {
		size_t module_len = sizeof(IGNORE_WRONG_MODULE_NAME) - 1;
		size_t opt_len = strlen(reader_options) + 1;
		char *p;
		/* Set default read options. */
		if ((p = malloc(module_len + opt_len)) == NULL)
			lafe_errc(1, errno, "Out of memory");
		/* Prepend magic code to ignore options for
		 * a format or  modules which are not added to
		 *  the archive read object. */
		memcpy(p, IGNORE_WRONG_MODULE_NAME, module_len);
		memcpy(p + module_len, reader_options, opt_len);
		r = archive_read_set_options(a, p);
		free(p);
		if (r == ARCHIVE_FATAL)
			lafe_errc(1, 0, "%s", archive_error_string(a));
		else
			archive_clear_error(a);
	}
	if (ARCHIVE_OK != archive_read_set_options(a, bsdtar->option_options))
		lafe_errc(1, 0, "%s", archive_error_string(a));
	if (bsdtar->flags & OPTFLAG_IGNORE_ZEROS)
		if (archive_read_set_options(a,
		    "read_concatenated_archives") != ARCHIVE_OK)
			lafe_errc(1, 0, "%s", archive_error_string(a));
	if (bsdtar->passphrase != NULL)
		r = archive_read_add_passphrase(a, bsdtar->passphrase);
	else
		r = archive_read_set_passphrase_callback(a, bsdtar,
			&passphrase_callback);
	if (r != ARCHIVE_OK)
		lafe_errc(1, 0, "%s", archive_error_string(a));
	if (archive_read_open_filename(a, bsdtar->filename,
					bsdtar->bytes_per_block))
		lafe_errc(1, 0, "Error opening archive: %s",
		    archive_error_string(a));

	do_chdir(bsdtar);

	if (mode == 'x') {
		/* Set an extract callback so that we can handle SIGINFO. */
		progress_data.bsdtar = bsdtar;
		progress_data.archive = a;
		archive_read_extract_set_progress_callback(a, progress_func,
		    &progress_data);
	}

	if (mode == 'x' && (bsdtar->flags & OPTFLAG_CHROOT)) {
#if HAVE_CHROOT
		if (chroot(".") != 0)
			lafe_errc(1, errno, "Can't chroot to \".\"");
#else
		lafe_errc(1, 0,
		    "chroot isn't supported on this platform");
#endif
	}

#if defined(_WIN32) && !defined(__CYGWIN__)
	if (mode == 'x' && (bsdtar->flags & OPTFLAG_STDOUT)) {
		_setmode(1, _O_BINARY);
	}
#endif

	for (;;) {
		/* Support --fast-read option */
		const char *p;
		if ((bsdtar->flags & OPTFLAG_FAST_READ) &&
		    archive_match_path_unmatched_inclusions(bsdtar->matching) == 0)
			break;

		r = archive_read_next_header(a, &entry);
		progress_data.entry = entry;
		if (r == ARCHIVE_EOF)
			break;
		if (r < ARCHIVE_OK)
			lafe_warnc(0, "%s", archive_error_string(a));
		if (r <= ARCHIVE_WARN)
			bsdtar->return_value = 1;
		if (r == ARCHIVE_RETRY) {
			/* Retryable error: try again */
			lafe_warnc(0, "Retrying...");
			continue;
		}
		if (r == ARCHIVE_FATAL)
			break;
		p = archive_entry_pathname(entry);
		if (p == NULL || p[0] == '\0') {
			lafe_warnc(0, "Archive entry has empty or unreadable filename ... skipping.");
			bsdtar->return_value = 1;
			continue;
		}

		if (bsdtar->uid >= 0) {
			archive_entry_set_uid(entry, bsdtar->uid);
			archive_entry_set_uname(entry, NULL);
		}
		if (bsdtar->gid >= 0) {
			archive_entry_set_gid(entry, bsdtar->gid);
			archive_entry_set_gname(entry, NULL);
		}
		if (bsdtar->uname)
			archive_entry_set_uname(entry, bsdtar->uname);
		if (bsdtar->gname)
			archive_entry_set_gname(entry, bsdtar->gname);

		/*
		 * Note that pattern exclusions are checked before
		 * pathname rewrites are handled.  This gives more
		 * control over exclusions, since rewrites always lose
		 * information.  (For example, consider a rewrite
		 * s/foo[0-9]/foo/.  If we check exclusions after the
		 * rewrite, there would be no way to exclude foo1/bar
		 * while allowing foo2/bar.)
		 */
		if (archive_match_excluded(bsdtar->matching, entry))
			continue; /* Excluded by a pattern test. */

		if (mode == 't') {
			/* Perversely, gtar uses -O to mean "send to stderr"
			 * when used with -t. */
			out = (bsdtar->flags & OPTFLAG_STDOUT) ?
			    stderr : stdout;

			/*
			 * TODO: Provide some reasonable way to
			 * preview rewrites.  gtar always displays
			 * the unedited path in -t output, which means
			 * you cannot easily preview rewrites.
			 */
			if (bsdtar->verbose < 2)
				safe_fprintf(out, "%s",
				    archive_entry_pathname(entry));
			else
				list_item_verbose(bsdtar, out, entry);
			fflush(out);
			r = archive_read_data_skip(a);
			if (r == ARCHIVE_WARN) {
				fprintf(out, "\n");
				lafe_warnc(0, "%s",
				    archive_error_string(a));
			}
			if (r == ARCHIVE_RETRY) {
				fprintf(out, "\n");
				lafe_warnc(0, "%s",
				    archive_error_string(a));
			}
			if (r == ARCHIVE_FATAL) {
				fprintf(out, "\n");
				lafe_warnc(0, "%s",
				    archive_error_string(a));
				bsdtar->return_value = 1;
				break;
			}
			fprintf(out, "\n");
		} else {
			/* Note: some rewrite failures prevent extraction. */
			if (edit_pathname(bsdtar, entry))
				continue; /* Excluded by a rewrite failure. */

			if ((bsdtar->flags & OPTFLAG_INTERACTIVE) &&
			    !yes("extract '%s'", archive_entry_pathname(entry)))
				continue;

			if (bsdtar->verbose > 1) {
				/* GNU tar uses -tv format with -xvv */
				safe_fprintf(stderr, "x ");
				list_item_verbose(bsdtar, stderr, entry);
				fflush(stderr);
			} else if (bsdtar->verbose > 0) {
				/* Format follows SUSv2, including the
				 * deferred '\n'. */
				safe_fprintf(stderr, "x %s",
				    archive_entry_pathname(entry));
				fflush(stderr);
			}

			/* TODO siginfo_printinfo(bsdtar, 0); */

			if (bsdtar->flags & OPTFLAG_STDOUT)
				r = archive_read_data_into_fd(a, 1);
			else
				r = archive_read_extract2(a, entry, writer);
			if (r != ARCHIVE_OK) {
				if (!bsdtar->verbose)
					safe_fprintf(stderr, "%s", archive_entry_pathname(entry));
				safe_fprintf(stderr, ": %s: %s",
				    archive_error_string(a),
				    strerror(archive_errno(a)));
				if (!bsdtar->verbose)
					fprintf(stderr, "\n");
				bsdtar->return_value = 1;
			}
			if (bsdtar->verbose)
				fprintf(stderr, "\n");
			if (r == ARCHIVE_FATAL)
				break;
		}
	}


	r = archive_read_close(a);
	if (r != ARCHIVE_OK)
		lafe_warnc(0, "%s", archive_error_string(a));
	if (r <= ARCHIVE_WARN)
		bsdtar->return_value = 1;

	if (bsdtar->verbose > 2)
		fprintf(stdout, "Archive Format: %s,  Compression: %s\n",
		    archive_format_name(a), archive_filter_name(a, 0));

	archive_read_free(a);
}